

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_role(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  BUFFER *buffer;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *in_RSI;
  long in_RDI;
  size_t len;
  bool found;
  BUFFER *output;
  CHAR_DATA *victim;
  char obuf [16384];
  char arg1 [16384];
  char buf [16384];
  CHAR_DATA *in_stack_ffffffffffff3fa8;
  CHAR_DATA *in_stack_ffffffffffff3fb0;
  CHAR_DATA *in_stack_ffffffffffff3fb8;
  char *in_stack_ffffffffffff3fc0;
  BUFFER *in_stack_ffffffffffff3fc8;
  char *in_stack_ffffffffffff3fd8;
  char local_c018 [9160];
  char *in_stack_ffffffffffff63b0;
  CHAR_DATA *in_stack_ffffffffffff63b8;
  char *in_stack_ffffffffffff63d0;
  char local_8018 [16336];
  char *in_stack_ffffffffffffbfb8;
  CHAR_DATA *in_stack_ffffffffffffbfc0;
  
  bVar1 = is_npc(in_stack_ffffffffffff3fa8);
  if (bVar1) {
    return;
  }
  if (*in_RSI != '\0') {
    smash_tilde(in_RSI);
    pCVar3 = (CHAR_DATA *)
             one_argument((char *)in_stack_ffffffffffff3fb0,(char *)in_stack_ffffffffffff3fa8);
    iVar2 = strcmp(local_8018,"show");
    if (((iVar2 == 0) && (bVar1 = is_immortal(in_stack_ffffffffffff3fa8), bVar1)) &&
       (iVar2 = get_trust(in_stack_ffffffffffff3fa8), 0x34 < iVar2)) {
      pCVar3 = get_char_world(in_stack_ffffffffffff63b8,in_stack_ffffffffffff63b0);
      if (pCVar3 == (CHAR_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
        return;
      }
      bVar1 = is_npc(in_stack_ffffffffffff3fa8);
      if (!bVar1) {
        send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
        send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
        if ((pCVar3->pcdata->role != (char *)0x0) && (*pCVar3->pcdata->role != '\0')) {
          buffer = new_buf();
          add_buf(in_stack_ffffffffffff3fc8,in_stack_ffffffffffff3fc0);
          buf_string(buffer);
          page_to_char((char *)in_stack_ffffffffffff3fb0,in_stack_ffffffffffff3fa8);
          free_buf((BUFFER *)0x557144);
          return;
        }
        send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
        return;
      }
      send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
      return;
    }
    iVar2 = strcmp(local_8018,"-");
    if (iVar2 == 0) {
      if ((*(long *)(*(long *)(in_RDI + 0xc0) + 0xb28) != 0) &&
         (**(char **)(*(long *)(in_RDI + 0xc0) + 0xb28) != '\0')) {
        strcpy(local_c018,*(char **)(*(long *)(in_RDI + 0xc0) + 0xb28));
        bVar1 = false;
        sVar4 = strlen(local_c018);
        do {
          if (sVar4 == 0) {
            local_c018[0] = '\0';
            free_pstring((char *)in_stack_ffffffffffff3fb0);
            pcVar5 = palloc_string(in_stack_ffffffffffff3fd8);
            *(char **)(*(long *)(in_RDI + 0xc0) + 0xb28) = pcVar5;
            send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
            return;
          }
          if (local_c018[sVar4] == '\r') {
            if (bVar1) {
              local_c018[sVar4 + 1] = '\0';
              free_pstring((char *)in_stack_ffffffffffff3fb0);
              pcVar5 = palloc_string(in_stack_ffffffffffff3fd8);
              *(char **)(*(long *)(in_RDI + 0xc0) + 0xb28) = pcVar5;
              send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
              return;
            }
            if (sVar4 != 0) {
              sVar4 = sVar4 - 1;
            }
            bVar1 = true;
          }
          sVar4 = sVar4 - 1;
        } while( true );
      }
      send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
      return;
    }
    iVar2 = strcmp(local_8018,"+");
    if (iVar2 == 0) {
      local_c018[0] = '\0';
      if (*(long *)(*(long *)(in_RDI + 0xc0) + 0xb28) != 0) {
        strcat(local_c018,*(char **)(*(long *)(in_RDI + 0xc0) + 0xb28));
      }
      pcVar5 = local_c018;
      if (*(char *)&pCVar3->next == '\0') {
        pCVar3 = (CHAR_DATA *)0x7bd85a;
      }
      strcat(pcVar5,(char *)pCVar3);
      strcat(local_c018,"\n\r");
      pcVar6 = (char *)strlen(local_c018);
      if (*(long *)(*(long *)(in_RDI + 0xc0) + 0xb20) == 0) {
        sVar4 = 0;
      }
      else {
        sVar4 = strlen(*(char **)(*(long *)(in_RDI + 0xc0) + 0xb20));
      }
      if ((char *)0x3c18 < pcVar6 + sVar4) {
        send_to_char(pcVar5,pCVar3);
        return;
      }
      free_pstring(pcVar6);
      pcVar6 = palloc_string(in_stack_ffffffffffff3fd8);
      *(char **)(*(long *)(in_RDI + 0xc0) + 0xb28) = pcVar6;
      send_to_char(pcVar5,pCVar3);
      return;
    }
    iVar2 = strcmp(local_8018,"add");
    if (iVar2 == 0) {
      if ((*(long *)(*(long *)(in_RDI + 0xc0) + 0xb28) != 0) &&
         (**(char **)(*(long *)(in_RDI + 0xc0) + 0xb28) != '\0')) {
        add_role(in_stack_ffffffffffffbfc0,in_stack_ffffffffffffbfb8);
        free_pstring((char *)in_stack_ffffffffffff3fb0);
        *(undefined8 *)(*(long *)(in_RDI + 0xc0) + 0xb28) = 0;
        show_role(in_stack_ffffffffffff3fb0);
        return;
      }
      send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
      return;
    }
    bVar1 = str_cmp(local_8018,"format");
    if (!bVar1) {
      if (*(long *)(*(long *)(in_RDI + 0xc0) + 0xb28) == 0) {
        send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
        return;
      }
      pcVar5 = format_string(in_stack_ffffffffffff63d0);
      *(char **)(*(long *)(in_RDI + 0xc0) + 0xb28) = pcVar5;
      send_to_char(in_stack_ffffffffffff3fc0,in_stack_ffffffffffff3fb8);
      return;
    }
  }
  show_role(in_stack_ffffffffffff3fb0);
  if (*(long *)(*(long *)(in_RDI + 0xc0) + 0xb28) != 0) {
    show_temp_role(in_stack_ffffffffffff3fb0);
  }
  return;
}

Assistant:

void do_role(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_BUF], arg1[MAX_BUF], obuf[MAX_BUF];

	if (is_npc(ch))
		return;

	if (argument[0] != '\0')
	{
		buf[0] = '\0';
		smash_tilde(argument);
		argument = one_argument(argument, arg1);

		if (!strcmp(arg1, "show") && is_immortal(ch) && get_trust(ch) > 52)
		{
			auto victim = get_char_world(ch, argument);
			if (victim == nullptr)
			{
				send_to_char("They aren't here.\n\r", ch);
				return;
			}

			if (is_npc(victim))
			{
				send_to_char("You can't role a mob.\n\r", ch);
				return;
			}

			send_to_char(victim->true_name, ch);
			send_to_char("'s role:\n\r", ch);

			if (victim->pcdata->role == nullptr || victim->pcdata->role[0] == '\0')
			{
				send_to_char("No role available.\n\r", ch);
				return;
			}

			auto output = new_buf();
			add_buf(output, victim->pcdata->role);
			page_to_char(buf_string(output), ch);
			free_buf(output);
			return;
		}

		if (!strcmp(arg1, "-"))
		{
			if (ch->pcdata->temp_role == nullptr || ch->pcdata->temp_role[0] == '\0')
			{
				send_to_char("No lines left to remove.\n\r", ch);
				return;
			}

			strcpy(obuf, ch->pcdata->temp_role);

			auto found = false;
			for (auto len = strlen(obuf); len > 0; len--)
			{
				if (obuf[len] != '\r')
					continue;

				if (!found)
				{
					if (len > 0)
						len--;

					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';
					free_pstring(ch->pcdata->temp_role);
					ch->pcdata->temp_role = palloc_string(obuf);

					send_to_char("Line deleted.\n\r", ch);
					return;
				}
			}

			obuf[0] = '\0';
			free_pstring(ch->pcdata->temp_role);
			ch->pcdata->temp_role = palloc_string(obuf);

			send_to_char("Line deleted.\n\r", ch);
			return;
		}

		if (!strcmp(arg1, "+"))
		{
			obuf[0] = '\0';

			if (ch->pcdata->temp_role)
				strcat(obuf, ch->pcdata->temp_role);

			strcat(obuf, argument[0] != '\0' ? argument : " ");
			strcat(obuf, "\n\r");

			if (strlen(obuf) + (ch->pcdata->role ? strlen(ch->pcdata->role) : 0) > MAX_BUF - 1000)
			{
				send_to_char("Sorry, your role is too long.\n\r", ch);
				return;
			}

			free_pstring(ch->pcdata->temp_role);
			ch->pcdata->temp_role = palloc_string(obuf);

			send_to_char("Ok.\n\r", ch);
			return;
		}

		if (!strcmp(arg1, "add"))
		{
			if (ch->pcdata->temp_role == nullptr || ch->pcdata->temp_role[0] == '\0')
			{
				send_to_char("You have no role in progress to add.\n\r", ch);
				return;
			}
			else
			{
				add_role(ch, ch->pcdata->temp_role);
				free_pstring(ch->pcdata->temp_role);
				ch->pcdata->temp_role = nullptr;
				show_role(ch);
			}

			return;
		}

		if (!str_cmp(arg1, "format"))
		{
			if (!ch->pcdata->temp_role)
			{
				send_to_char("You have no role in progress to format.\n\r", ch);
				return;
			}

			ch->pcdata->temp_role = format_string(ch->pcdata->temp_role);

			send_to_char("Your role in progress has been formatted.\n\r", ch);
			return;
		}
	}

	show_role(ch);

	if (ch->pcdata->temp_role != nullptr)
		show_temp_role(ch);
}